

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

void lzham::lzham_delete_array<unsigned_short>(lzham_malloc_context context,unsigned_short *p)

{
  lzham_malloc_context in_RSI;
  uint32 num_check;
  uint32 num;
  
  if ((in_RSI != (lzham_malloc_context)0x0) &&
     (*(uint *)((long)in_RSI + -4) == (*(uint *)((long)in_RSI + -8) ^ 0xffffffff))) {
    lzham_free(in_RSI,*(void **)((long)in_RSI + -8));
  }
  return;
}

Assistant:

inline void lzham_delete_array(lzham_malloc_context context, T* p)
   {
      if (p)
      {
         const uint32 num = reinterpret_cast<uint32*>(p)[-1];
         const uint32 num_check = reinterpret_cast<uint32*>(p)[-2];
         LZHAM_ASSERT(num && (num == ~num_check));
         if (num == ~num_check)
         {
            if (!LZHAM_IS_SCALAR_TYPE(T))
            {
               helpers::destruct_array(p, num);
            }

            lzham_free(context, reinterpret_cast<uint8*>(p) - LZHAM_MIN_ALLOC_ALIGNMENT);
         }
      }
   }